

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar10 = *arg2 + *arg1;
  uVar1 = (ulong)CARRY8(*arg2,*arg1);
  uVar8 = arg1[1] + uVar1;
  uVar2 = arg2[2] + arg1[2];
  uVar4 = (ulong)CARRY8(arg2[2],arg1[2]);
  uVar5 = arg2[3] + arg1[3];
  uVar6 = (ulong)CARRY8(arg1[1],uVar1);
  uVar9 = uVar8 + arg2[1];
  uVar1 = (ulong)CARRY8(uVar8,arg2[1]);
  uVar8 = uVar2 + uVar6;
  uVar3 = uVar8 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar2,uVar6) || CARRY8(uVar8,uVar1));
  uVar8 = uVar4 + uVar5;
  uVar2 = uVar8 + uVar1;
  uVar7 = (ulong)(byte)-((0x7998f7b9022d759a < uVar10) + -1);
  uVar6 = uVar9 - uVar7;
  uVar7 = (ulong)(byte)-((-1 - (uVar9 < uVar7)) + (0xcf846e86789051d2 < uVar6));
  uVar11 = uVar3 - uVar7;
  uVar7 = (ulong)(byte)-((-1 - (uVar3 < uVar7)) + (0xab1ec85e6b41c8a9 < uVar11));
  uVar12 = uVar2 - uVar7;
  uVar1 = -(ulong)((byte)(CARRY8(arg2[3],arg1[3]) + (CARRY8(uVar4,uVar5) || CARRY8(uVar8,uVar1))) <
                  (byte)-((-1 - (uVar2 < uVar7)) + (0x9b9f605f5a858106 < uVar12)));
  uVar8 = ~uVar1;
  *out1 = uVar10 + 0x86670846fdd28a65 & uVar8 | uVar10 & uVar1;
  out1[1] = uVar6 + 0x307b9179876fae2d & uVar8 | uVar9 & uVar1;
  out1[2] = uVar11 + 0x54e137a194be3756 & uVar8 | uVar3 & uVar1;
  out1[3] = uVar8 & uVar12 + 0x64609fa0a57a7ef9 | uVar1 & uVar2;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_add(
    uint64_t out1[4], const uint64_t arg1[4], const uint64_t arg2[4]) {
    uint64_t x1;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x2;
    uint64_t x3;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x4;
    uint64_t x5;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x6;
    uint64_t x7;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x8;
    uint64_t x9;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x10;
    uint64_t x11;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x1, &x2, 0x0, (arg1[0]), (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x3, &x4, x2, (arg1[1]), (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x5, &x6, x4, (arg1[2]), (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(
        &x7, &x8, x6, (arg1[3]), (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x9, &x10, 0x0, x1, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x11, &x12, x10, x3, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x13, &x14, x12, x5, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x15, &x16, x14, x7, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x17, &x18, x16,
                                                               x8, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x19, x18, x9, x1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x20, x18, x11, x3);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x21, x18, x13, x5);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x22, x18, x15, x7);
    out1[0] = x19;
    out1[1] = x20;
    out1[2] = x21;
    out1[3] = x22;
}